

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  MethodDescriptor *pMVar1;
  ArenaStringPtr *pAVar2;
  string *psVar3;
  MethodOptions *pMVar4;
  MethodOptions *pMVar5;
  Arena *pAVar6;
  string *psVar7;
  string local_48;
  
  psVar7 = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  pAVar6 = (Arena *)(proto->_internal_metadata_).
                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    .ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
  }
  psVar3 = (proto->name_).ptr_;
  if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance(&proto->name_,pAVar6,psVar7);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  pMVar1 = this + 0x18;
  if (*(once_flag **)(this + 0x28) != (once_flag *)0x0) {
    local_48._M_dataplus._M_p = (pointer)pMVar1;
    std::
    call_once<void(&)(google::protobuf::internal::LazyDescriptor*),google::protobuf::internal::LazyDescriptor*>
              (*(once_flag **)(this + 0x28),internal::LazyDescriptor::OnceStatic,
               (LazyDescriptor **)&local_48);
  }
  if (*(char *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pMVar1->field_0x0)->_M_allocated_capacity + 0x89) == '\0') {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".","");
    pAVar6 = (Arena *)(proto->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      .ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
    }
    psVar7 = (proto->input_type_).ptr_;
    if (psVar7 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance(&proto->input_type_,pAVar6,&local_48);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar7);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
  pAVar2 = &proto->input_type_;
  pAVar6 = (Arena *)(proto->_internal_metadata_).
                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    .ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
  }
  psVar7 = pAVar2->ptr_;
  if (psVar7 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar2,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar7 = pAVar2->ptr_;
  }
  if (*(once_flag **)(this + 0x28) != (once_flag *)0x0) {
    local_48._M_dataplus._M_p = (pointer)pMVar1;
    std::
    call_once<void(&)(google::protobuf::internal::LazyDescriptor*),google::protobuf::internal::LazyDescriptor*>
              (*(once_flag **)(this + 0x28),internal::LazyDescriptor::OnceStatic,
               (LazyDescriptor **)&local_48);
  }
  std::__cxx11::string::_M_append((char *)psVar7,**(ulong **)(*(long *)(this + 0x18) + 8));
  pMVar1 = this + 0x38;
  if (*(once_flag **)(this + 0x48) != (once_flag *)0x0) {
    local_48._M_dataplus._M_p = (pointer)pMVar1;
    std::
    call_once<void(&)(google::protobuf::internal::LazyDescriptor*),google::protobuf::internal::LazyDescriptor*>
              (*(once_flag **)(this + 0x48),internal::LazyDescriptor::OnceStatic,
               (LazyDescriptor **)&local_48);
  }
  if (*(char *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pMVar1->field_0x0)->_M_allocated_capacity + 0x89) == '\0') {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".","");
    pAVar6 = (Arena *)(proto->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      .ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
    }
    psVar7 = (proto->output_type_).ptr_;
    if (psVar7 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance(&proto->output_type_,pAVar6,&local_48);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar7);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
  pAVar2 = &proto->output_type_;
  pAVar6 = (Arena *)(proto->_internal_metadata_).
                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    .ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
  }
  psVar7 = pAVar2->ptr_;
  if (psVar7 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar2,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar7 = pAVar2->ptr_;
  }
  if (*(once_flag **)(this + 0x48) != (once_flag *)0x0) {
    local_48._M_dataplus._M_p = (pointer)pMVar1;
    std::
    call_once<void(&)(google::protobuf::internal::LazyDescriptor*),google::protobuf::internal::LazyDescriptor*>
              (*(once_flag **)(this + 0x48),internal::LazyDescriptor::OnceStatic,
               (LazyDescriptor **)&local_48);
  }
  std::__cxx11::string::_M_append((char *)psVar7,**(ulong **)(*(long *)(this + 0x38) + 8));
  pMVar5 = *(MethodOptions **)(this + 0x58);
  pMVar4 = MethodOptions::default_instance();
  if (pMVar5 != pMVar4) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    pMVar5 = proto->options_;
    if (pMVar5 == (MethodOptions *)0x0) {
      pAVar6 = (Arena *)(proto->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
      }
      pMVar5 = Arena::CreateMaybeMessage<google::protobuf::MethodOptions>(pAVar6);
      proto->options_ = pMVar5;
    }
    MethodOptions::CopyFrom(pMVar5,*(MethodOptions **)(this + 0x58));
  }
  if (this[0x60] == (MethodDescriptor)0x1) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x10;
    proto->client_streaming_ = true;
  }
  if (this[0x61] == (MethodDescriptor)0x1) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x20;
    proto->server_streaming_ = true;
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  proto->mutable_input_type()->append(input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  proto->mutable_output_type()->append(output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
}